

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O2

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sf,bool sparse)

{
  TwoStageDynamicBayesianNetwork *this_00;
  undefined1 auVar1 [16];
  pointer pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Index IVar7;
  Index IVar8;
  ostream *poVar9;
  ulong uVar10;
  pointer puVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  ObservationModelMappingSparse *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar13;
  size_type sVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  E *this_02;
  int nrS;
  Index post_sucsI;
  long lVar18;
  Index joI;
  size_t i_1;
  ulong uVar19;
  size_t i;
  ulong uVar20;
  double p1;
  double dVar21;
  double extraout_XMM0_Qa;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM2 [16];
  TransitionModelMappingSparse *local_1f0;
  ulong local_1e8;
  double local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_X;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X;
  vector<unsigned_long,_std::allocator<unsigned_long>_> input_factor_sizes;
  Scope post_Y_Sc;
  Scope XScope;
  Scope AScope;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_factor_sizes;
  Scope YScope;
  vector<unsigned_long,_std::allocator<unsigned_long>_> output_factor_sizes;
  Scope sfScope;
  vector<unsigned_int,_std::allocator<unsigned_int>_> O;
  
  pSVar2 = (this->_m_2dbn)._m_YSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar19 = (ulong)sf;
  if (*(pointer *)
       &pSVar2[uVar19].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl ==
      pSVar2[uVar19].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &this->_m_2dbn;
    poVar9 = std::operator<<((ostream *)&std::cout,"Marginalizing State Factor ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar20 = 0;
    local_1e8 = 1;
    while( true ) {
      uVar10 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
      if (uVar10 <= uVar20) break;
      if (uVar19 != uVar20) {
        puVar11 = (pointer)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xc0))
                                     (this,uVar20 & 0xffffffff);
        input_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start = puVar11;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&new_factor_sizes,(value_type_conflict2 *)&input_factor_sizes);
        local_1e8 = local_1e8 * (long)puVar11;
      }
      uVar20 = uVar20 + 1;
    }
    pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xb8))(this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&input_factor_sizes,pvVar12);
    input_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar19] = 1;
    pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xb8))(this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&output_factor_sizes,pvVar12)
    ;
    pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x100))(this);
    if (this->_m_cached_FlatTM == false) {
      MADPComponentDiscreteActions::ConstructJointActions(&this->_m_A);
    }
    if (this->_m_cached_FlatOM == false) {
      MADPComponentDiscreteObservations::ConstructJointObservations(&this->_m_O);
    }
    this->_m_sparse_FlatTM = sparse;
    this->_m_sparse_FlatOM = sparse;
    nrS = (int)local_1e8;
    if (this->_m_eventObservability == true) {
      if (sparse) {
        local_1f0 = (TransitionModelMappingSparse *)operator_new(0x28);
        iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        TransitionModelMappingSparse::TransitionModelMappingSparse(local_1f0,nrS,iVar4);
      }
      else {
        local_1f0 = (TransitionModelMappingSparse *)operator_new(0x28);
        iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        TransitionModelMapping::TransitionModelMapping
                  ((TransitionModelMapping *)local_1f0,nrS,iVar4);
      }
      if (this->_m_sparse_FlatOM == true) {
        this_01 = (ObservationModelMappingSparse *)operator_new(0x30);
        iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        iVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
        EventObservationModelMappingSparse::EventObservationModelMappingSparse
                  ((EventObservationModelMappingSparse *)this_01,nrS,iVar4,iVar5);
      }
      else {
        this_01 = (ObservationModelMappingSparse *)operator_new(0x30);
        iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        iVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
        EventObservationModelMapping::EventObservationModelMapping
                  ((EventObservationModelMapping *)this_01,nrS,iVar4,iVar5);
      }
    }
    else {
      if (sparse) {
        local_1f0 = (TransitionModelMappingSparse *)operator_new(0x28);
        iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        TransitionModelMappingSparse::TransitionModelMappingSparse(local_1f0,nrS,iVar4);
      }
      else {
        local_1f0 = (TransitionModelMappingSparse *)operator_new(0x28);
        iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        TransitionModelMapping::TransitionModelMapping
                  ((TransitionModelMapping *)local_1f0,nrS,iVar4);
      }
      if (this->_m_sparse_FlatOM == true) {
        this_01 = (ObservationModelMappingSparse *)operator_new(0x30);
        iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        iVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
        ObservationModelMappingSparse::ObservationModelMappingSparse(this_01,nrS,iVar4,iVar5);
      }
      else {
        this_01 = (ObservationModelMappingSparse *)operator_new(0x30);
        iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        iVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
        ObservationModelMapping::ObservationModelMapping
                  ((ObservationModelMapping *)this_01,nrS,iVar4,iVar5);
      }
    }
    pvVar13 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xb0))(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&XScope.super_SDT,pvVar13);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&YScope.super_SDT,&XScope.super_SDT);
    uVar20 = 0;
    AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      uVar10 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
      if (uVar10 <= uVar20) break;
      Scope::Insert(&AScope,(Index)uVar20);
      uVar20 = uVar20 + 1;
    }
    sfScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sfScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sfScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Scope::Insert(&sfScope,sf);
    sVar14 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
    A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&X,sVar14,(value_type_conflict1 *)&A,(allocator_type *)&Y);
    sVar14 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&A,sVar14,(value_type_conflict1 *)&Y,(allocator_type *)&post_X);
    sVar14 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
    post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&Y,sVar14,(value_type_conflict1 *)&post_X,(allocator_type *)&post_Y);
    do {
      do {
        do {
          uVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x138))(this,&A);
          post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar18 = 0;
          post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          for (uVar20 = 0;
              uVar20 < (ulong)((long)Y.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               CONCAT44(Y.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        Y.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 2);
              uVar20 = uVar20 + 1) {
            if (uVar19 != uVar20) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&post_X,(value_type_conflict1 *)
                                 ((long)X.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar18));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&post_Y,(value_type_conflict1 *)
                                 (CONCAT44(Y.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           Y.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar18
                                 ));
              Scope::Insert(&post_Y_Sc,(Index)uVar20);
            }
            lVar18 = lVar18 + 4;
          }
          IVar7 = IndexTools::IndividualToJointIndices(&post_X,&new_factor_sizes);
          IVar8 = IndexTools::IndividualToJointIndices(&post_Y,&new_factor_sizes);
          uVar20 = (ulong)IVar8;
          p1 = TwoStageDynamicBayesianNetwork::GetYProbability(this_00,&X,&A,&Y);
          dVar21 = p1;
          bVar3 = Globals::EqualProbability(p1,0.0);
          if (!bVar3) {
            (*(local_1f0->super_TransitionModelDiscrete).super_TransitionModelDiscreteInterface.
              super_TransitionModel._vptr_TransitionModel[4])
                      (local_1f0,(ulong)IVar7,(ulong)uVar6,uVar20);
            if (1e-12 < dVar21 + p1) {
              (*(local_1f0->super_TransitionModelDiscrete).super_TransitionModelDiscreteInterface.
                super_TransitionModel._vptr_TransitionModel[5])
                        (local_1f0,(ulong)IVar7,(ulong)uVar6,(ulong)IVar8);
            }
          }
          dVar21 = TwoStageDynamicBayesianNetwork::GetYProbabilityGeneral
                             (this_00,&XScope,&X,&AScope,&A,&YScope,&Y,&post_Y_Sc,&post_Y);
          uVar10 = 0;
          while( true ) {
            uVar15 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
            if (uVar15 <= uVar10) break;
            pvVar13 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 400))
                                (this,uVar10);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &O.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,pvVar13);
            auVar22._0_8_ =
                 TwoStageDynamicBayesianNetwork::GetOProbability
                           (this_00,&X,&A,&Y,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &O.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            auVar22._8_8_ = 0;
            auVar23 = auVar22;
            bVar3 = Globals::EqualProbability(auVar22._0_8_,0.0);
            if (!bVar3) {
              (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
                super_ObservationModel._vptr_ObservationModel[5])
                        (this_01,(ulong)IVar7,(ulong)uVar6,uVar20,uVar10);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = p1;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = auVar22._0_8_ * dVar21;
              auVar23 = vfmadd132sd_fma(auVar24,auVar23,auVar1);
              if (1e-12 < auVar23._0_8_) {
                (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
                  super_ObservationModel._vptr_ObservationModel[7])
                          (this_01,(ulong)IVar7,(ulong)uVar6,uVar20,uVar10);
              }
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&O.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            uVar10 = (ulong)((int)uVar10 + 1);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&post_Y_Sc);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          bVar3 = IndexTools::Increment(&Y,&output_factor_sizes);
        } while (!bVar3);
        bVar3 = IndexTools::Increment(&A,pvVar12);
      } while (!bVar3);
      bVar3 = IndexTools::Increment(&X,&input_factor_sizes);
    } while (!bVar3);
    sVar14 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
              (&A,sVar14,(value_type_conflict1 *)&post_X);
    for (uVar19 = 0; uVar19 < local_1e8; uVar19 = (ulong)((int)uVar19 + 1)) {
      uVar20 = 0;
      while( true ) {
        uVar10 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        if (uVar10 <= uVar20) break;
        for (uVar10 = 0; uVar10 < local_1e8; uVar10 = (ulong)((int)uVar10 + 1)) {
          uVar15 = 0;
          local_1d8 = 0.0;
          while( true ) {
            uVar16 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
            if (uVar16 <= uVar15) break;
            dVar21 = extraout_XMM0_Qa;
            (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
              super_ObservationModel._vptr_ObservationModel[5])(this_01,uVar19,uVar20,uVar10,uVar15)
            ;
            uVar15 = (ulong)((int)uVar15 + 1);
            local_1d8 = local_1d8 + dVar21;
          }
          uVar15 = 0;
          while( true ) {
            uVar16 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
            if (uVar16 <= uVar15) break;
            if (local_1d8 <= 0.0) {
              uVar17 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
              auVar23 = vcvtusi2sd_avx512f(in_XMM2,uVar17);
              (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
                super_ObservationModel._vptr_ObservationModel[7])
                        (1.0 / auVar23._0_8_,this_01,uVar19,uVar20,uVar10,uVar15);
            }
            else {
              dVar21 = local_1d8;
              (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
                super_ObservationModel._vptr_ObservationModel[5])
                        (this_01,uVar19,uVar20,uVar10,uVar15);
              if (1e-12 < dVar21) {
                (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
                  super_ObservationModel._vptr_ObservationModel[7])
                          (dVar21 / local_1d8,this_01,uVar19,uVar20,uVar10,uVar15);
              }
            }
            uVar15 = (ulong)((int)uVar15 + 1);
          }
        }
        uVar20 = (ulong)((int)uVar20 + 1);
      }
    }
    if ((this->_m_cached_FlatTM != false) && (this->_m_p_tModel != (TransitionModelDiscrete *)0x0))
    {
      (*(this->_m_p_tModel->super_TransitionModelDiscreteInterface).super_TransitionModel.
        _vptr_TransitionModel[1])();
    }
    if ((this->_m_cached_FlatOM == true) && (this->_m_p_oModel != (ObservationModelDiscrete *)0x0))
    {
      (*(this->_m_p_oModel->super_ObservationModelDiscreteInterface).super_ObservationModel.
        _vptr_ObservationModel[1])();
    }
    this->_m_p_tModel = &local_1f0->super_TransitionModelDiscrete;
    this->_m_p_oModel = &this_01->super_ObservationModelDiscrete;
    this->_m_cached_FlatTM = true;
    this->_m_cached_FlatOM = true;
    RemoveStateFactor(this,sf);
    SanityCheck(this);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&sfScope);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&AScope);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YScope);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XScope);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&output_factor_sizes.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&input_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              );
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    return;
  }
  this_02 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_02,"Cannot marginalize a state factor with NS dependencies. NYI.");
  __cxa_throw(this_02,&E::typeinfo,E::~E);
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel(const Index sf, bool sparse)
{
    const Scope& YSoI_sf = _m_2dbn.GetYSoI_Y(sf);
  
    if(!YSoI_sf.empty()){
      throw E("Cannot marginalize a state factor with NS dependencies. NYI.");
    }

    cout << "Marginalizing State Factor " << sf << endl;

    size_t nrS = 1;
    vector<size_t> new_factor_sizes;
    for(size_t i = 0; i < GetNrStateFactors(); i++){
        if(i == sf)
            continue;
        size_t nrX = GetNrValuesForFactor(i);
        nrS *= nrX;
        new_factor_sizes.push_back(nrX);
    }
    vector<size_t> input_factor_sizes = GetNrValuesPerFactor();
    input_factor_sizes[sf] = 1;
    vector<size_t> output_factor_sizes = GetNrValuesPerFactor();
    const vector<size_t>& actions = GetNrActions();

    if(!_m_cached_FlatTM)
        ConstructJointActions();
    if(!_m_cached_FlatOM)
        ConstructJointObservations();
    
    TransitionModelDiscrete* marginalized_tm;
    ObservationModelDiscrete* marginalized_om;

    _m_sparse_FlatTM = sparse;
    _m_sparse_FlatOM = sparse;

    if(_m_eventObservability)
    {
        if(_m_sparse_FlatTM)
            marginalized_tm = new 
                TransitionModelMappingSparse(nrS,
                                             GetNrJointActions());
        else
            marginalized_tm = new 
                TransitionModelMapping(nrS,
                                       GetNrJointActions());
        if(_m_sparse_FlatOM)
            marginalized_om = new 
                EventObservationModelMappingSparse(nrS,
                                                   GetNrJointActions(), 
                                                   GetNrJointObservations());
        else
            marginalized_om = new 
                EventObservationModelMapping(nrS,
                                             GetNrJointActions(), 
                                             GetNrJointObservations());
    }
    else
    {
        if(_m_sparse_FlatTM)
            marginalized_tm = new 
                TransitionModelMappingSparse(nrS,
                                             GetNrJointActions());
        else
            marginalized_tm = new 
                TransitionModelMapping(nrS,
                                       GetNrJointActions());      
        if(_m_sparse_FlatOM)
            marginalized_om = new 
                ObservationModelMappingSparse(nrS,
                                              GetNrJointActions(), 
                                              GetNrJointObservations());
        else
            marginalized_om = new 
                ObservationModelMapping(nrS,
                                        GetNrJointActions(), 
                                        GetNrJointObservations());
    }

    Scope XScope = GetAllStateFactorScope();
    Scope YScope(XScope);
    Scope AScope;
    for(size_t i = 0; i < GetNrAgents(); i++)
        AScope.Insert(i);
    Scope sfScope;
    sfScope.Insert(sf);

    vector<Index> X(GetNrStateFactors(),0);
    vector<Index> A(GetNrAgents(),0);
    vector<Index> Y(GetNrStateFactors(),0);
    do{
        do{
            do{
                Index jaI = IndividualToJointActionIndices(A);
                vector<Index> post_X;
                vector<Index> post_Y;
                Scope post_Y_Sc;
                for(size_t i = 0; i < Y.size(); i++)
                    if(i != sf){
                        post_X.push_back(X[i]);
                        post_Y.push_back(Y[i]);
                        post_Y_Sc.Insert(i);
                    }

                Index post_sI = IndexTools::IndividualToJointIndices(post_X, new_factor_sizes);
                Index post_sucsI = IndexTools::IndividualToJointIndices(post_Y, new_factor_sizes);
        
                double p_t = _m_2dbn.GetYProbability(X,A,Y);
                if(! Globals::EqualProbability(p_t, 0) )
                {
                    double post_p_t = marginalized_tm->Get(post_sI, jaI, post_sucsI);
                    double p_t_sum = post_p_t+p_t;
                    if(p_t_sum > Globals::PROB_PRECISION)
                        marginalized_tm->Set(post_sI, jaI, post_sucsI, p_t_sum); //marginalization
                }
                double post_p_given_sf = _m_2dbn.GetYProbabilityGeneral(XScope,
                                                                        X,
                                                                        AScope,
                                                                        A,
                                                                        YScope,
                                                                        Y,
                                                                        post_Y_Sc,
                                                                        post_Y);

                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    vector<Index> O = JointToIndividualObservationIndices(joI);
    
                    double p_o = _m_2dbn.GetOProbability(X,A,Y,O);
                    if(! Globals::EqualProbability(p_o, 0) )
                    {
                        double post_p_o = marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                        double p_o_sum = post_p_o + p_o*post_p_given_sf*p_t;
                        if(p_o_sum > Globals::PROB_PRECISION)
                            marginalized_om->Set(post_sI, jaI, post_sucsI, joI, p_o_sum); //marginalization
                    }
                }
            }while(!IndexTools::Increment( Y, output_factor_sizes ));
        }while(!IndexTools::Increment( A, actions ));
    }while(!IndexTools::Increment( X, input_factor_sizes ));

    A.assign(GetNrAgents(),0);
    //now we need to sanitize the observation model.
    for(Index post_sI = 0; post_sI < nrS; post_sI++){
        for(Index jaI = 0; jaI < GetNrJointActions(); jaI++){
            for(Index post_sucsI = 0; post_sucsI < nrS; post_sucsI++){
                double p_total = 0;
                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    p_total += marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                }
                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    if(p_total > 0){
                        double post_p_o = marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                        if(post_p_o > Globals::PROB_PRECISION)
                          marginalized_om->Set(post_sI, jaI, post_sucsI, joI, post_p_o/p_total); //normalization
                    }
                    else
                        marginalized_om->Set(post_sI, jaI, post_sucsI, joI, 1.0/GetNrJointObservations()); //impossible transition
                }
            }
        }
    }
    
    if(_m_cached_FlatTM)
        delete(_m_p_tModel);
    if(_m_cached_FlatOM)
        delete(_m_p_oModel);

    _m_p_tModel = marginalized_tm;
    _m_p_oModel = marginalized_om;

    _m_cached_FlatTM = true;
    _m_cached_FlatOM = true;  

    RemoveStateFactor(sf);

    SanityCheck();
}